

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::RenamingSubstitution::output
          (RenamingSubstitution *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  ostream *in_RDI;
  
  std::operator<<(in_RSI,"{ _query: ");
  poVar1 = Lib::operator<<(in_RDI,(Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                   *)in_RSI);
  std::operator<<(poVar1,", _result: ");
  poVar1 = Lib::operator<<(in_RDI,(Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                   *)in_RSI);
  std::operator<<(poVar1," }");
  return;
}

Assistant:

void output(std::ostream& out) const final override
      { out << "{ _query: " << _query << ", _result: " << _result << " }"; }